

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

void __thiscall QCborStreamWriter::startMap(QCborStreamWriter *this,quint64 count)

{
  quint64 in_RSI;
  _func_CborError_CborEncoder_ptr_CborEncoder_ptr_size_t *in_RDI;
  QCborStreamWriterPrivate *unaff_retaddr;
  
  std::unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>::
  operator->((unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_> *
             )0x8dea0c);
  QCborStreamWriterPrivate::createContainer(unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void QCborStreamWriter::startMap(quint64 count)
{
    d->createContainer(cbor_encoder_create_map, count);
}